

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

QString * __thiscall QGraphicsSceneBspTree::debug(QGraphicsSceneBspTree *this,int index)

{
  bool bVar1;
  const_reference pNVar2;
  const_reference this_00;
  int in_EDX;
  QGraphicsSceneBspTree *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QList<QList<QGraphicsItem_*>_> *this_01;
  QString *this_02;
  qreal a;
  QString *this_03;
  QByteArrayView QVar3;
  Node *node;
  QString *tmp;
  QRectF rect;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  QList<QGraphicsSceneBspTree::Node> *in_stack_fffffffffffffe60;
  char (*in_stack_fffffffffffffe68) [36];
  QByteArrayView *in_stack_fffffffffffffe70;
  QString *in_stack_fffffffffffffe78;
  QChar fillChar;
  QGraphicsSceneBspTree *in_stack_fffffffffffffe80;
  QString *pQVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffeb0;
  QChar local_d2;
  QChar local_d0;
  QChar local_ce;
  QChar local_cc;
  QChar local_ca;
  storage_type *local_c8;
  undefined1 local_b8 [144];
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  pNVar2 = QList<QGraphicsSceneBspTree::Node>::at
                     (in_stack_fffffffffffffe60,
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0xa18c2f);
  if (pNVar2->type == Leaf) {
    local_28.xp = -NAN;
    local_28.yp = -NAN;
    local_28.w = -NAN;
    local_28.h = -NAN;
    rectForIndex(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    QList<QList<QGraphicsItem_*>_>::operator[]
              ((QList<QList<QGraphicsItem_*>_> *)in_stack_fffffffffffffe60,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0xa18cae);
    if (!bVar1) {
      QByteArrayView::QByteArrayView<36ul>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      QVar3.m_data = local_c8;
      QVar3.m_size = (qsizetype)local_b8;
      QString::fromLatin1(QVar3);
      this_01 = (QList<QList<QGraphicsItem_*>_> *)QRectF::left(&local_28);
      QChar::QChar<char16_t,_true>(&local_ca,L' ');
      QString::arg<double,_true>
                (in_stack_fffffffffffffe78,(double)in_stack_fffffffffffffe70,
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 (char)((ulong)in_stack_fffffffffffffe68 >> 0x18),(int)((ulong)this_01 >> 0x20),
                 (QChar)(char16_t)((ulong)pQVar4 >> 0x30));
      this_02 = (QString *)QRectF::top(&local_28);
      QChar::QChar<char16_t,_true>(&local_cc,L' ');
      QString::arg<double,_true>
                (in_stack_fffffffffffffe78,(double)in_stack_fffffffffffffe70,
                 (int)((ulong)this_02 >> 0x20),(char)((ulong)this_02 >> 0x18),
                 (int)((ulong)this_01 >> 0x20),(QChar)(char16_t)((ulong)pQVar4 >> 0x30));
      a = QRectF::width(&local_28);
      QChar::QChar<char16_t,_true>(&local_ce,L' ');
      QString::arg<double,_true>
                (in_stack_fffffffffffffe78,a,(int)((ulong)this_02 >> 0x20),
                 (char)((ulong)this_02 >> 0x18),(int)((ulong)this_01 >> 0x20),
                 (QChar)(char16_t)((ulong)pQVar4 >> 0x30));
      this_03 = (QString *)QRectF::height(&local_28);
      QChar::QChar<char16_t,_true>(&local_d0,L' ');
      QString::arg<double,_true>
                (this_03,a,(int)((ulong)this_02 >> 0x20),(char)((ulong)this_02 >> 0x18),
                 (int)((ulong)this_01 >> 0x20),(QChar)(char16_t)((ulong)pQVar4 >> 0x30));
      fillChar.ucs = (char16_t)((ulong)this_03 >> 0x30);
      this_00 = QList<QList<QGraphicsItem_*>_>::operator[]
                          (this_01,CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QList<QGraphicsItem_*>::size(this_00);
      QChar::QChar<char16_t,_true>(&local_d2,L' ');
      QString::arg<long_long,_true>
                (this_02,(longlong)this_01,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                 fillChar);
      QString::operator+=((QString *)this_01,
                          (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QString::~QString((QString *)0xa18ebe);
      QString::~QString((QString *)0xa18ecb);
      QString::~QString((QString *)0xa18ed8);
      QString::~QString((QString *)0xa18ee5);
      QString::~QString((QString *)0xa18ef2);
      QString::~QString((QString *)0xa18eff);
    }
  }
  else if (pNVar2->type == Horizontal) {
    firstChildIndex(in_RSI,in_EDX);
    iVar5 = (int)((ulong)pNVar2 >> 0x20);
    debug((QGraphicsSceneBspTree *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0),iVar5);
    QString::operator+=((QString *)in_stack_fffffffffffffe60,
                        (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0xa18f54);
    firstChildIndex(in_RSI,in_EDX);
    debug((QGraphicsSceneBspTree *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0),iVar5);
    QString::operator+=((QString *)in_stack_fffffffffffffe60,
                        (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0xa18f98);
  }
  else {
    firstChildIndex(in_RSI,in_EDX);
    iVar5 = (int)((ulong)pNVar2 >> 0x20);
    debug((QGraphicsSceneBspTree *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0),iVar5);
    QString::operator+=((QString *)in_stack_fffffffffffffe60,
                        (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0xa18fdb);
    firstChildIndex(in_RSI,in_EDX);
    debug((QGraphicsSceneBspTree *)CONCAT44(in_EDX,in_stack_fffffffffffffeb0),iVar5);
    QString::operator+=((QString *)in_stack_fffffffffffffe60,
                        (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0xa19016);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QString QGraphicsSceneBspTree::debug(int index) const
{
    const Node *node = &nodes.at(index);

    QString tmp;
    if (node->type == Node::Leaf) {
        QRectF rect = rectForIndex(index);
        if (!leaves[node->leafIndex].isEmpty()) {
            tmp += QString::fromLatin1("[%1, %2, %3, %4] contains %5 items\n")
                   .arg(rect.left()).arg(rect.top())
                   .arg(rect.width()).arg(rect.height())
                   .arg(leaves[node->leafIndex].size());
        }
    } else {
        if (node->type == Node::Horizontal) {
            tmp += debug(firstChildIndex(index));
            tmp += debug(firstChildIndex(index) + 1);
        } else {
            tmp += debug(firstChildIndex(index));
            tmp += debug(firstChildIndex(index) + 1);
        }
    }

    return tmp;
}